

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O1

int __thiscall HttpTestListener::Start(HttpTestListener *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int opt;
  sockaddr_in addr;
  undefined4 local_2c;
  sockaddr local_28;
  
  local_28.sa_family = 0;
  local_28.sa_data[0] = '\0';
  local_28.sa_data[1] = '\0';
  local_28.sa_data[2] = '\0';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\0';
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  iVar2 = socket(2,1,6);
  this->fd_ = iVar2;
  local_28.sa_data._2_4_ = inet_addr("127.0.0.1");
  uVar1 = (ushort)this->local_port_;
  local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  local_28.sa_family = 2;
  local_2c = 1;
  setsockopt(this->fd_,1,2,&local_2c,4);
  iVar2 = bind(this->fd_,&local_28,0x10);
  iVar3 = -1;
  if (iVar2 == 0) {
    iVar2 = listen(this->fd_,5);
    if (iVar2 == 0) {
      iVar3 = 0;
      pthread_create(&this->thread_,(pthread_attr_t *)0x0,ResponseHandleRun,this);
    }
  }
  return iVar3;
}

Assistant:

int HttpTestListener::Start() {
  sockaddr_in addr = {};
  fd_ = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  addr.sin_addr.s_addr = inet_addr("127.0.0.1");
  addr.sin_port = htons(local_port_);
  addr.sin_family = AF_INET;
  int opt=1;
  setsockopt(fd_,SOL_SOCKET,SO_REUSEADDR,&opt,sizeof(opt));
  if(bind(fd_, (struct sockaddr *)&addr, sizeof(sockaddr_in)) != 0) {
    return -1;
  }
  if(listen(fd_, 5) != 0) {
    return -1;
  }

  pthread_create(&thread_, NULL, ResponseHandleRun, this);

  return 0;
}